

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O1

char * query_to_string(CURL *curlh,course_query *query)

{
  ushort uVar1;
  int iVar2;
  int *piVar3;
  undefined8 uVar4;
  string_buffer strbuf;
  char buf [6];
  string_buffer local_40;
  char local_26 [6];
  
  iVar2 = strbuf_init(&local_40,0x400);
  if (iVar2 == 0) {
    iVar2 = add_param(&local_40,curlh,"ScriptManager1","UpdatePanel1|btn_search");
    if ((((((iVar2 == 0) && (iVar2 = add_param(&local_40,curlh,"__ASYNCPOST","true"), iVar2 == 0))
          && (iVar2 = add_param(&local_40,curlh,"__EVENTTARGET",anon_var_dwarf_2415 + 0xc),
             iVar2 == 0)) &&
         ((iVar2 = add_param(&local_40,curlh,"__EVENTARGUMENT",anon_var_dwarf_2415 + 0xc),
          iVar2 == 0 &&
          (iVar2 = add_param(&local_40,curlh,"__EVENTVALIDATION",
                             "/wEWrgIC38mR5QsCvq+njw0C6JbEHQKz0pKLCwL43p+wDgKy49ueCgKujNPFAgKz0p6LCwL43puwDgKy4+eeCgKujN/FAgKz0pqLCwL43qewDgKy4+OeCgKujNvFAgKz0qaLCwKy4++eCgL43qOwDgKujOfFAgKz0qKLCwKy4+ueCgL43q+wDgKujOPFAgKz0q6LCwKy4/eeCgL43quwDgKujO/FAgKz0qqLCwL43rewDgKy4/OeCgKujOvFAgK00s6KCwKz45eeCgKvjI/FAgL53suzDgK00sqKCwKz45OeCgKvjIvFAgK00paLCwKz49+eCgKvjNfFAgK00pKLCwKz49ueCgKvjNPFAgK00p6LCwKz4+eeCgKvjN/FAgK00pqLCwKz4+OeCgKvjNvFAgK00qaLCwKz4++eCgKvjOfFAgK00qKLCwKz4+ueCgKvjOPFAgK00q6LCwKz4/eeCgKvjO/FAgK00qqLCwKz4/OeCgKvjOvFAgKL0s6KCwLZgpKwCAKc3a+ODwLmoqHNDQLEq5JOAoOLn8UNApzd34YFAvP0hZELApzd24YFAsyZgVsC6YaTuw4C1t7GtAgCtObbiwwC8PTVjgUC8PTpjgUC8PSxkQsCiPmpagKq8MSyCwLwx4ikCQLX3u6uAgLX3qKvAgLX3v5vAoj5zboLAvu1u/oJAvu1t6oPAvu1j9gDAsKrpuUDAv7AzJsPAs2ZhVsCjri8hQgCjovr6wYCs+brtAsChcr12AkC/MCEmw8Cm6z+xAQCm6y21Q0CmN3LxgMCrrPn9wIC//TRjgUCmN3vwAoC//SFpggC0o+UvAECs+azqAgCwauy0AYC0t7itAgCn+/w7gMC/fSJpggClPm5ugsCsebbrwUC0I/UuwEC/fTNpQgCpb2M+wwC6vSRpggC6vS9uAQC6vTtxAYCu7iIogQC6vTlQAL1tYtWAoP57boLAsyPzLsBApPdq6sLAvb0/aUIAvb0vZsIAp2ijZ8JAoH53YsCApDd64UFAs3e1q8CApDdo44PAoeLh6AFAvTAhJsPAvf0+ZALApqi6coKAonviMANAvf0sZELAvT0pY4FAuKQnEUC9PThjgUC4vTJpQgChO+IjA8C9NjjrAsCs7iIhQgC4vStjgUC9NjX2g8Cs7j0zAMCsIvTxA0C4PTlpQgC4PTZtgECsYvLxA0C4fTNjgUC67Wbqg8CuPntugsC67WrjwYC2/GI2wcC7/SNpggCmpC4RQLNjZf0BwK47I3LCgLn5cySBgKfmp5NAvzMvo8IApHbgOQCAumXwqQDAqPFhY4PAumXzqQDAsiej6QMAsWe96UMAvWzkNAOAqywic8LAtPlgJEGAoGa7k4CpeHDuwUC/v6DkQUC1qTu+wQCpbC9zwsCidvU5AIC6rPM0A4CtKyT+wEC/bOE0A4Cjf6DkQUCp8X5jw8CjJrSSQLssuLHCgK40v2iDALUu6frAQLI0t2NDAKauMbpDgLQ4O6sDQL62P+nCgLkmoWSCQLkmsniCQLkms3jCQLFmumaCQLFmu2bCQKOnez1DAKpnej0DAKpnez1DAKpnfD2DAKpnfT3DAKpnfjoDAKpnfzpDAKpnYDrDAKpncT7DAKpncj8DAKOneTzDAKGncerCQKJ8u3FBQKI8u3FBQKL8u3FBQKTxqktAru1lOQEAqL5l+QEAtij4e0IAqWpmv0JAqKZqaQIAvWfxgMCtoCMxgUC6ez5PQLb0sD7BgLz393ABgKHhLG2CQKk2Lz8BgLMw5rCDAKS9P7ODALuidnpCQL738ndBgL7363ABgK43OCZDQKC2IDsAwKa2LimAgK+85axDgLe5JX9AQL5353dAQK/s7WfDwL3kvqcCwK196aDAQKZ9q/4CAKi3MjCBAKMkt67BwLkooPpBQKb2uH3AQLdiaWaCwKN16yZBgLppbPeAwLl3/n4AgKrjZa3CgK4jfK2CwKHt53pDQL9oMuCBwKfqaCuDQLd7962CQKhwdrmDAKD/9KtCwKikMyVAwKekICVAwL8+6fGCwK2i/SP..." /* TRUNCATED STRING LITERAL */
                            ), iVar2 == 0)))) &&
        ((iVar2 = add_param(&local_40,curlh,"__LASTFOCUS",anon_var_dwarf_2415 + 0xc), iVar2 == 0 &&
         ((iVar2 = add_param(&local_40,curlh,"__SCROLLPOSITIONX","0"), iVar2 == 0 &&
          (iVar2 = add_param(&local_40,curlh,"__SCROLLPOSITIONY","0"), iVar2 == 0)))))) &&
       ((iVar2 = add_param(&local_40,curlh,"__VIEWSTATE",
                           "/wEPDwUJNzU4ODU5NDI3D2QWAgIDD2QWFgILDw8WAh4LTmF2aWdhdGVVcmwFL2h0dHA6Ly9yZWdpc3RyYXIudWNyLmVkdS9yZWdpc3RyYXIvZGVmYXVsdC5hc3B4ZGQCDQ8PFgIfAAVDaHR0cDovL3JlZ2lzdHJhci51Y3IuZWR1L1JlZ2lzdHJhci9TY2hlZHVsZS1vZi1DbGFzc2VzL0RlZmF1bHQuYXNweGRkAhEPDxYCHwAFR2h0dHA6Ly9yZWdpc3RyYXIudWNyLmVkdS9yZWdpc3RyYXIvcmVnaXN0ZXJpbmctZm9yLWNsYXNzZXMvZGVmYXVsdC5hc3B4ZGQCEw8PFgIfAAVAaHR0cDovL3JlZ2lzdHJhci51Y3IuZWR1L3JlZ2lzdHJhci90dWl0aW9uLWFuZC1mZWVzL2RlZmF1bHQuYXNweGRkAhUPDxYCHwAFTWh0dHA6Ly9yZWdpc3RyYXIudWNyLmVkdS9yZWdpc3RyYXIvYWNhZGVtaWMtY2FsZW5kYXIvZmluYWwtZXhhbS1zY2hlZHVsZS5hc3B4ZGQCFw8PFgIfAAVIaHR0cDovL3JlZ2lzdHJhci51Y3IuZWR1L3JlZ2lzdHJhci9ndWlkZS10by1ncmFkdWF0aW9uL2RlZ3JlZS1hdWRpdC5hc3B4ZGQCGw9kFgJmD2QWBgIBDw8WAh4EVGV4dGVkZAIDD2QWFAIDD2QWAmYPDxYCHghJbWFnZVVybAURfi9pbWFnZXMvcGx1cy5QTkdkZAIFD2QWDAIBDxAPFgYeDURhdGFUZXh0RmllbGQFBERlc2MeDkRhdGFWYWx1ZUZpZWxkBQRUZXJtHgtfIURhdGFCb3VuZGdkEBU8BzE2IEZBTEwJMTYgU1VNTUVSCTE2IFNQUklORwkxNiBXSU5URVIHMTUgRkFMTAkxNSBTVU1NRVIJMTUgU1BSSU5HCTE1IFdJTlRFUgcxNCBGQUxMCTE0IFNVTU1FUgkxNCBTUFJJTkcJMTQgV0lOVEVSBzEzIEZBTEwJMTMgU1BSSU5HCTEzIFNVTU1FUgkxMyBXSU5URVIHMTIgRkFMTAkxMiBTUFJJTkcJMTIgU1VNTUVSCTEyIFdJTlRFUgcxMSBGQUxMCTExIFNQUklORwkxMSBTVU1NRVIJMTEgV0lOVEVSBzEwIEZBTEwJMTAgU1VNTUVSCTEwIFNQUklORwkxMCBXSU5URVIHMDkgRkFMTAkwOSBTUFJJTkcJMDkgV0lOVEVSCTA5IFNVTU1FUgcwOCBGQUxMCTA4IFNQUklORwkwOCBXSU5URVIHMDcgRkFMTAkwNyBTUFJJTkcJMDcgV0lOVEVSBzA2IEZBTEwJMDYgU1BSSU5HCTA2IFdJTlRFUgcwNSBGQUxMCTA1IFNQUklORwkwNSBXSU5URVIHMDQgRkFMTAkwNCBTUFJJTkcJMDQgV0lOVEVSBzAzIEZBTEwJMDMgU1BSSU5HCTAzIFdJTlRFUgcwMiBGQUxMCTAyIFNQUklORwkwMiBXSU5URVIHMDEgRkFMTAkwMSBTUFJJTkcJMDEgV0lOVEVSBzAwIEZBTEwJMDAgU1BSSU5HCTAwIFdJTlRFUgc5OSBGQUxMFTwDMTZGAzE2VQMxNlMDMTZXAzE1RgMxNVUDMTVTAzE1VwMxNEYDMTRVAzE0UwMxNFcDMTNGAzEzUwMxM1UDMTNXAzEyRgMxMlMDMTJVAzEyVwMxMUYDMTFTAzExVQMxMVcDMTBGAzEwVQMxMFMDMTBXAzA5RgMwOVMDMDlXAzA5VQMwOEYDMDhTAzA4VwMwN0YDMDdTAzA3VwMwNkYDMDZTAzA2VwMwNUYDMDVTAzA1VwMwNEYDMDRTAzA0VwMwM0YDMDNTAzAzVwMwMkYDMDJTAzAyVwMwMUYDMDFTAzAxVwMwMEYDMDBTAzAwVwM5OUYUKwM8Z2dnZ2dnZ2dnZ2dnZ2dnZ2dnZ2dnZ2dnZ2dnZ2dnZ2dnZ2dnZ2dnZ2dnZ2dnZ2dnZ2dnZ2dnZ2dnZ2dnFgFmZAIDDxAPFgYf..." /* TRUNCATED STRING LITERAL */
                          ), iVar2 == 0 &&
        (iVar2 = add_param(&local_40,curlh,"btn_search",anon_var_dwarf_2415), iVar2 == 0)))) {
      set_term_code(local_26,query->quarter,query->year);
      iVar2 = add_param(&local_40,curlh,"drp_term",local_26);
      if ((((iVar2 == 0) &&
           (iVar2 = add_param(&local_40,curlh,"drp_subjectArea",SUBJECT_AREAS[query->subject_area]),
           iVar2 == 0)) &&
          (iVar2 = add_param(&local_40,curlh,"txtbx_courseTitle",query->course_title), iVar2 == 0))
         && ((iVar2 = add_param(&local_40,curlh,"txt_instructor",query->instructor), iVar2 == 0 &&
             (iVar2 = add_param(&local_40,curlh,"txtbx_courseNumber",query->course_number),
             iVar2 == 0)))) {
        uVar1 = query->start_hour;
        if (uVar1 == 0x19) {
          local_26[0] = '\0';
        }
        else {
          uVar4 = 0x61;
          if (0xc < uVar1) {
            uVar4 = 0x70;
          }
          sprintf(local_26,"%02u%c.m",(ulong)((uint)uVar1 + (uVar1 / 3 & 0xfffffffc) * -3 & 0xffff),
                  uVar4);
        }
        iVar2 = add_param(&local_40,curlh,"drp_startTime",local_26);
        if (iVar2 == 0) {
          local_26[0] = (char)query->course_status + 0x30;
          local_26[1] = 0;
          iVar2 = add_param(&local_40,curlh,"drp_fullOpenClasses",local_26);
          if (((((((iVar2 == 0) &&
                  (iVar2 = add_param(&local_40,curlh,"drp_courseRange",
                                     COURSE_RANGES[query->course_range]), iVar2 == 0)) &&
                 ((iVar2 = add_param(&local_40,curlh,"drp_location",
                                     COURSE_LOCATIONS[query->course_location]), iVar2 == 0 &&
                  (iVar2 = add_param(&local_40,curlh,"drp_breadth",BREADTH_COURSES[query->breadth]),
                  iVar2 == 0)))) &&
                ((query->graduate_quantitative != true ||
                 (iVar2 = add_param(&local_40,curlh,"cbGraduateQuant","on"), iVar2 == 0)))) &&
               ((query->days[0] != true ||
                (iVar2 = add_param(&local_40,curlh,"chkbx_mon","on"), iVar2 == 0)))) &&
              ((((query->days[1] != true ||
                 (iVar2 = add_param(&local_40,curlh,"chkbx_tue","on"), iVar2 == 0)) &&
                ((query->days[2] != true ||
                 (iVar2 = add_param(&local_40,curlh,"chkbx_wed","on"), iVar2 == 0)))) &&
               (((query->days[3] != true ||
                 (iVar2 = add_param(&local_40,curlh,"chkbx_thur","on"), iVar2 == 0)) &&
                ((query->days[4] != true ||
                 (iVar2 = add_param(&local_40,curlh,"chkbx_fri","on"), iVar2 == 0)))))))) &&
             ((query->days[5] != true ||
              (iVar2 = add_param(&local_40,curlh,"chkbx_sat","on"), iVar2 == 0)))) {
            strbuf_append_char(&local_40,'\0');
            return local_40.data;
          }
        }
      }
    }
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    strbuf_destroy(&local_40);
    *piVar3 = iVar2;
  }
  return (char *)0x0;
}

Assistant:

char *query_to_string(CURL *curlh, const struct course_query *query)
{
	struct string_buffer strbuf;
	char buf[6];

	if (strbuf_init(&strbuf, 1024)) {
		return NULL;
	}

	ADD_PARAM(&strbuf, curlh, "ScriptManager1", "UpdatePanel1|btn_search");
	ADD_PARAM(&strbuf, curlh, "__ASYNCPOST", "true");
	ADD_PARAM(&strbuf, curlh, "__EVENTTARGET", "");
	ADD_PARAM(&strbuf, curlh, "__EVENTARGUMENT", "");
	ADD_PARAM(&strbuf, curlh, "__EVENTVALIDATION", blob_event_validation);
	ADD_PARAM(&strbuf, curlh, "__LASTFOCUS", "");
	ADD_PARAM(&strbuf, curlh, "__SCROLLPOSITIONX", "0");
	ADD_PARAM(&strbuf, curlh, "__SCROLLPOSITIONY", "0");
	ADD_PARAM(&strbuf, curlh, "__VIEWSTATE", blob_view_state);
	ADD_PARAM(&strbuf, curlh, "btn_search", "\xc2\xa0Search >>\n");

	set_term_code(buf, query->quarter, query->year);
	ADD_PARAM(&strbuf, curlh, "drp_term", buf);
	ADD_PARAM(&strbuf, curlh, "drp_subjectArea", SUBJECT_AREAS[query->subject_area]);
	ADD_PARAM(&strbuf, curlh, "txtbx_courseTitle", query->course_title);
	ADD_PARAM(&strbuf, curlh, "txt_instructor", query->instructor);
	ADD_PARAM(&strbuf, curlh, "txtbx_courseNumber", query->course_number);
	set_start_time(buf, query->start_hour);
	ADD_PARAM(&strbuf, curlh, "drp_startTime", buf);
	set_course_status(buf, query->course_status);
	ADD_PARAM(&strbuf, curlh, "drp_fullOpenClasses", buf);
	ADD_PARAM(&strbuf, curlh, "drp_courseRange", COURSE_RANGES[query->course_range]);
	ADD_PARAM(&strbuf, curlh, "drp_location", COURSE_LOCATIONS[query->course_location]);
	ADD_PARAM(&strbuf, curlh, "drp_breadth", BREADTH_COURSES[query->breadth]);

	if (query->graduate_quantitative) ADD_PARAM(&strbuf, curlh, "cbGraduateQuant", "on");
	if (query->days[MONDAY]) ADD_PARAM(&strbuf, curlh, "chkbx_mon", "on");
	if (query->days[TUESDAY]) ADD_PARAM(&strbuf, curlh, "chkbx_tue", "on");
	if (query->days[WEDNESDAY]) ADD_PARAM(&strbuf, curlh, "chkbx_wed", "on");
	if (query->days[THURSDAY]) ADD_PARAM(&strbuf, curlh, "chkbx_thur", "on");
	if (query->days[FRIDAY]) ADD_PARAM(&strbuf, curlh, "chkbx_fri", "on");
	if (query->days[SATURDAY]) ADD_PARAM(&strbuf, curlh, "chkbx_sat", "on");

	strbuf_append_char(&strbuf, '\0');
	return strbuf.data;
}